

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExtraEclipseCDT4Generator.cxx
# Opt level: O2

void cmExtraEclipseCDT4Generator::AddEnvVar(ostream *out,char *envVar,cmLocalGenerator *lg)

{
  cmMakefile *this;
  bool bVar1;
  cmState *this_00;
  string *psVar2;
  cmake *this_01;
  long lVar3;
  ostream *poVar4;
  string valueToUse;
  string cacheEntryName;
  string envVarValue;
  
  this = lg->Makefile;
  envVarValue._M_dataplus._M_p = (pointer)&envVarValue.field_2;
  envVarValue._M_string_length = 0;
  envVarValue.field_2._M_local_buf[0] = '\0';
  bVar1 = cmsys::SystemTools::GetEnv(envVar,&envVarValue);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&cacheEntryName,"CMAKE_ECLIPSE_ENVVAR_",(allocator<char> *)&valueToUse);
  std::__cxx11::string::append((char *)&cacheEntryName);
  this_00 = cmLocalGenerator::GetState(lg);
  psVar2 = cmState::GetInitializedCacheValue(this_00,&cacheEntryName);
  valueToUse._M_dataplus._M_p = (pointer)&valueToUse.field_2;
  valueToUse._M_string_length = 0;
  valueToUse.field_2._M_local_buf[0] = '\0';
  if (psVar2 == (string *)0x0 && !bVar1) goto LAB_0020cae2;
  if (!bVar1 || psVar2 != (string *)0x0) {
    if (bVar1 || psVar2 == (string *)0x0) {
      std::__cxx11::string::_M_assign((string *)&valueToUse);
      lVar3 = std::__cxx11::string::find((string *)&valueToUse,(ulong)&envVarValue);
      if (lVar3 == -1) {
        std::__cxx11::string::_M_assign((string *)&valueToUse);
        cmMakefile::AddCacheDefinition
                  (this,&cacheEntryName,valueToUse._M_dataplus._M_p,cacheEntryName._M_dataplus._M_p,
                   STRING,true);
        this_01 = cmMakefile::GetCMakeInstance(this);
        psVar2 = cmLocalGenerator::GetBinaryDirectory_abi_cxx11_(lg);
        goto LAB_0020ca25;
      }
    }
    else {
      std::__cxx11::string::_M_assign((string *)&valueToUse);
    }
  }
  else {
    std::__cxx11::string::_M_assign((string *)&valueToUse);
    cmMakefile::AddCacheDefinition
              (this,&cacheEntryName,valueToUse._M_dataplus._M_p,cacheEntryName._M_dataplus._M_p,
               STRING,true);
    this_01 = cmMakefile::GetCMakeInstance(this);
    psVar2 = cmLocalGenerator::GetBinaryDirectory_abi_cxx11_(lg);
LAB_0020ca25:
    cmake::SaveCache(this_01,psVar2);
  }
  if (valueToUse._M_string_length != 0) {
    poVar4 = std::operator<<(out,envVar);
    poVar4 = std::operator<<(poVar4,"=");
    poVar4 = std::operator<<(poVar4,(string *)&valueToUse);
    std::operator<<(poVar4,"|");
  }
LAB_0020cae2:
  std::__cxx11::string::~string((string *)&valueToUse);
  std::__cxx11::string::~string((string *)&cacheEntryName);
  std::__cxx11::string::~string((string *)&envVarValue);
  return;
}

Assistant:

void cmExtraEclipseCDT4Generator::AddEnvVar(std::ostream& out,
                                            const char* envVar,
                                            cmLocalGenerator* lg)
{
  cmMakefile* mf = lg->GetMakefile();

  // get the variables from the environment and from the cache and then
  // figure out which one to use:

  std::string envVarValue;
  const bool envVarSet = cmSystemTools::GetEnv(envVar, envVarValue);

  std::string cacheEntryName = "CMAKE_ECLIPSE_ENVVAR_";
  cacheEntryName += envVar;
  const std::string* cacheValue =
    lg->GetState()->GetInitializedCacheValue(cacheEntryName);

  // now we have both, decide which one to use
  std::string valueToUse;
  if (!envVarSet && cacheValue == nullptr) {
    // nothing known, do nothing
    valueToUse.clear();
  } else if (envVarSet && cacheValue == nullptr) {
    // The variable is in the env, but not in the cache. Use it and put it
    // in the cache
    valueToUse = envVarValue;
    mf->AddCacheDefinition(cacheEntryName, valueToUse.c_str(),
                           cacheEntryName.c_str(), cmStateEnums::STRING, true);
    mf->GetCMakeInstance()->SaveCache(lg->GetBinaryDirectory());
  } else if (!envVarSet && cacheValue != nullptr) {
    // It is already in the cache, but not in the env, so use it from the cache
    valueToUse = *cacheValue;
  } else {
    // It is both in the cache and in the env.
    // Use the version from the env. except if the value from the env is
    // completely contained in the value from the cache (for the case that we
    // now have a PATH without MSVC dirs in the env. but had the full PATH with
    // all MSVC dirs during the cmake run which stored the var in the cache:
    valueToUse = *cacheValue;
    if (valueToUse.find(envVarValue) == std::string::npos) {
      valueToUse = envVarValue;
      mf->AddCacheDefinition(cacheEntryName, valueToUse.c_str(),
                             cacheEntryName.c_str(), cmStateEnums::STRING,
                             true);
      mf->GetCMakeInstance()->SaveCache(lg->GetBinaryDirectory());
    }
  }

  if (!valueToUse.empty()) {
    out << envVar << "=" << valueToUse << "|";
  }
}